

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void X25519_public_from_private(uint8_t *out_public_value,uint8_t *private_key)

{
  fe zminusy_inv;
  fe_loose zminusy;
  fe_loose zplusy;
  ge_p3 A;
  ulong local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong uStack_150;
  fe local_140;
  fe_loose local_118;
  fe_loose local_f0;
  ge_p3 local_c8;
  
  uStack_160 = *(undefined8 *)(private_key + 8);
  local_158 = *(undefined8 *)(private_key + 0x10);
  local_168 = *(ulong *)private_key & 0xfffffffffffffff8;
  uStack_150 = *(ulong *)(private_key + 0x18) & 0x3fffffffffffffff | 0x4000000000000000;
  x25519_ge_scalarmult_base(&local_c8,(uint8_t *)&local_168);
  fe_add(&local_f0,&local_c8.Z,&local_c8.Y);
  fe_sub(&local_118,&local_c8.Z,&local_c8.Y);
  fe_loose_invert(&local_140,&local_118);
  fe_mul_impl(local_140.v,local_f0.v,local_140.v);
  fe_tobytes(out_public_value,&local_140);
  return;
}

Assistant:

void X25519_public_from_private(uint8_t out_public_value[32],
                                const uint8_t private_key[32]) {
#if defined(BORINGSSL_X25519_NEON)
  if (CRYPTO_is_NEON_capable()) {
    static const uint8_t kMongomeryBasePoint[32] = {9};
    x25519_NEON(out_public_value, private_key, kMongomeryBasePoint);
    return;
  }
#endif

  uint8_t e[32];
  OPENSSL_memcpy(e, private_key, 32);
  e[0] &= 248;
  e[31] &= 127;
  e[31] |= 64;

  ge_p3 A;
  x25519_ge_scalarmult_base(&A, e);

  // We only need the u-coordinate of the curve25519 point. The map is
  // u=(y+1)/(1-y). Since y=Y/Z, this gives u=(Z+Y)/(Z-Y).
  fe_loose zplusy, zminusy;
  fe zminusy_inv;
  fe_add(&zplusy, &A.Z, &A.Y);
  fe_sub(&zminusy, &A.Z, &A.Y);
  fe_loose_invert(&zminusy_inv, &zminusy);
  fe_mul_tlt(&zminusy_inv, &zplusy, &zminusy_inv);
  fe_tobytes(out_public_value, &zminusy_inv);
  CONSTTIME_DECLASSIFY(out_public_value, 32);
}